

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown.cpp
# Opt level: O3

optional<markdown::LinkIds::Target> * __thiscall
markdown::LinkIds::find
          (optional<markdown::LinkIds::Target> *__return_storage_ptr__,LinkIds *this,string *id)

{
  pointer pcVar1;
  size_t key_hash;
  node_pointer ppVar2;
  string local_60;
  string local_40;
  
  pcVar1 = (id->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + id->_M_string_length);
  _scrubKey(&local_60,&local_40);
  key_hash = boost::unordered::detail::
             table<boost::unordered::detail::map<std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_markdown::LinkIds::Target>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_markdown::LinkIds::Target,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::hash((table<boost::unordered::detail::map<std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_markdown::LinkIds::Target>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_markdown::LinkIds::Target,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)this,&local_60);
  ppVar2 = boost::unordered::detail::
           table<boost::unordered::detail::map<std::allocator<std::pair<std::__cxx11::string_const,markdown::LinkIds::Target>>,std::__cxx11::string,markdown::LinkIds::Target,boost::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
           ::find_node_impl<std::__cxx11::string,std::equal_to<std::__cxx11::string>>
                     ((table<boost::unordered::detail::map<std::allocator<std::pair<std::__cxx11::string_const,markdown::LinkIds::Target>>,std::__cxx11::string,markdown::LinkIds::Target,boost::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
                       *)this,key_hash,&local_60,
                      (equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)((this->mTable).table_.
                          super_functions<boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .funcs_ +
                         ((this->mTable).table_.
                          super_functions<boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .current_ & 1)));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (ppVar2 == (node_pointer)0x0) {
    (__return_storage_ptr__->super_type).m_initialized = false;
  }
  else {
    (__return_storage_ptr__->super_type).m_initialized = false;
    boost::optional_detail::optional_base<markdown::LinkIds::Target>::construct
              (&__return_storage_ptr__->super_type,
               (argument_type)((long)&(ppVar2->value_base_).data_.data_ + 0x20));
  }
  return __return_storage_ptr__;
}

Assistant:

optional<LinkIds::Target> LinkIds::find(const std::string& id) const {
	Table::const_iterator i=mTable.find(_scrubKey(id));
	if (i!=mTable.end()) return i->second;
	else return none;
}